

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O1

void __thiscall
FloatInterval_DifferenceOfProducts_Test::TestBody(FloatInterval_DifferenceOfProducts_Test *this)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  undefined1 *puVar12;
  long lVar13;
  char *pcVar14;
  uint64_t uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  Interval IVar26;
  undefined8 extraout_XMM0_Qb;
  undefined1 in_ZMM0 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM5 [16];
  AssertionResult gtest_ar;
  Interval b;
  RNG rng;
  double pr;
  Interval c;
  Interval d;
  Interval a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  internal local_f0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertHelper local_e0;
  Interval local_d8;
  RNG local_d0;
  long local_c0;
  double local_b8;
  Interval local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_80;
  double local_78;
  double local_70;
  Interval local_68;
  Interval local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  
  puVar12 = &DAT_5851f42d4c957f2e;
  uVar15 = 1;
  uVar16 = 0;
  lVar13 = 0;
  do {
    uVar10 = (uVar16 >> 0x1b ^ uVar16) * -0x7e25210b43d22bb3;
    local_d0.state = (uint64_t)(puVar12 + (uVar10 >> 0x21 ^ uVar10) * 0x5851f42d4c957f2d);
    auVar17._0_4_ = in_ZMM1._0_4_;
    local_d0.inc = uVar15;
    auVar27._0_8_ = getFloat(&local_d0,in_ZMM0._0_4_,auVar17._0_4_);
    auVar27._8_56_ = extraout_var;
    local_98 = auVar27._0_16_;
    if (auVar27._0_4_ < 0.0) {
      auVar19 = vmovshdup_avx(local_98);
      fVar40 = auVar19._0_4_;
      if (fVar40 <= 0.0) {
        auVar33._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
        auVar33._8_4_ = auVar19._8_4_ ^ 0x80000000;
        auVar33._12_4_ = auVar19._12_4_ ^ 0x80000000;
        fVar36 = -auVar27._0_4_;
        uVar3 = vcmpss_avx512f(auVar19,local_98,1);
        bVar8 = (bool)((byte)uVar3 & 1);
        auVar18._4_12_ = auVar33._4_12_;
        auVar18._0_4_ = (uint)bVar8 * (int)fVar36 + (uint)!bVar8 * (int)-fVar40;
        uVar3 = vcmpss_avx512f(local_98,auVar19,1);
        bVar8 = (bool)((byte)uVar3 & 1);
        auVar17._0_4_ = (Float)((uint)bVar8 * (int)fVar36 + (uint)!bVar8 * (int)-fVar40);
        auVar17._4_12_ = auVar18._4_12_;
        local_98 = vinsertps_avx(auVar18,auVar17,0x10);
      }
      else {
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        auVar17 = vxorps_avx512vl(local_98,auVar4);
        auVar19 = vmaxss_avx(auVar19,auVar17);
        auVar19 = vmaxss_avx(auVar19,ZEXT816(0) << 0x40);
        local_98 = vinsertps_avx(auVar19,auVar19,0x1d);
      }
    }
    local_60 = (Interval)vmovlps_avx(local_98);
    auVar28._0_8_ = getFloat(&local_d0,local_98._0_4_,auVar17._0_4_);
    auVar28._8_56_ = extraout_var_00;
    auVar19 = auVar28._0_16_;
    if (auVar28._0_4_ < 0.0) {
      auVar17 = vmovshdup_avx(auVar19);
      if (auVar17._0_4_ <= 0.0) {
        auVar37._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
        auVar37._8_4_ = auVar17._8_4_ ^ 0x80000000;
        auVar37._12_4_ = auVar17._12_4_ ^ 0x80000000;
        fVar40 = -auVar28._0_4_;
        uVar3 = vcmpss_avx512f(auVar17,auVar19,1);
        bVar8 = (bool)((byte)uVar3 & 1);
        auVar20._4_12_ = auVar37._4_12_;
        auVar20._0_4_ = (uint)bVar8 * (int)fVar40 + (uint)!bVar8 * (int)-auVar17._0_4_;
        uVar3 = vcmpss_avx512f(auVar19,auVar17,1);
        bVar8 = (bool)((byte)uVar3 & 1);
        auVar19._0_4_ = (uint)bVar8 * (int)fVar40 + (uint)!bVar8 * (int)-auVar17._0_4_;
        auVar19._4_12_ = auVar20._4_12_;
        auVar19 = vinsertps_avx(auVar20,auVar19,0x10);
      }
      else {
        auVar5._8_4_ = 0x80000000;
        auVar5._0_8_ = 0x8000000080000000;
        auVar5._12_4_ = 0x80000000;
        auVar19 = vxorps_avx512vl(auVar19,auVar5);
        auVar19 = vmaxss_avx(auVar17,auVar19);
        auVar19 = vmaxss_avx(auVar19,ZEXT816(0) << 0x40);
        auVar19 = vinsertps_avx(auVar19,auVar19,0x1d);
      }
    }
    local_d8 = (Interval)vmovlps_avx(auVar19);
    auVar29._0_8_ = getFloat(&local_d0,auVar19._0_4_,auVar17._0_4_);
    auVar29._8_56_ = extraout_var_01;
    auVar19 = auVar29._0_16_;
    if (auVar29._0_4_ < 0.0) {
      auVar17 = vmovshdup_avx(auVar19);
      if (auVar17._0_4_ <= 0.0) {
        auVar38._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
        auVar38._8_4_ = auVar17._8_4_ ^ 0x80000000;
        auVar38._12_4_ = auVar17._12_4_ ^ 0x80000000;
        fVar40 = -auVar29._0_4_;
        uVar3 = vcmpss_avx512f(auVar17,auVar19,1);
        bVar8 = (bool)((byte)uVar3 & 1);
        auVar21._4_12_ = auVar38._4_12_;
        auVar21._0_4_ = (uint)bVar8 * (int)fVar40 + (uint)!bVar8 * (int)-auVar17._0_4_;
        uVar3 = vcmpss_avx512f(auVar19,auVar17,1);
        bVar8 = (bool)((byte)uVar3 & 1);
        auVar22._0_4_ = (uint)bVar8 * (int)fVar40 + (uint)!bVar8 * (int)-auVar17._0_4_;
        auVar22._4_12_ = auVar21._4_12_;
        auVar19 = vinsertps_avx(auVar21,auVar22,0x10);
      }
      else {
        auVar6._8_4_ = 0x80000000;
        auVar6._0_8_ = 0x8000000080000000;
        auVar6._12_4_ = 0x80000000;
        auVar19 = vxorps_avx512vl(auVar19,auVar6);
        auVar19 = vmaxss_avx(auVar17,auVar19);
        auVar19 = vmaxss_avx(auVar19,ZEXT816(0) << 0x40);
        auVar19 = vinsertps_avx(auVar19,auVar19,0x1d);
      }
    }
    local_b0 = (Interval)vmovlps_avx(auVar19);
    auVar30._0_8_ = getFloat(&local_d0,auVar19._0_4_,auVar17._0_4_);
    auVar30._8_56_ = extraout_var_02;
    local_48 = auVar30._0_16_;
    if (auVar30._0_4_ < 0.0) {
      auVar17 = vmovshdup_avx(local_48);
      fVar40 = auVar17._0_4_;
      if (fVar40 <= 0.0) {
        auVar34._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
        auVar34._8_4_ = auVar17._8_4_ ^ 0x80000000;
        auVar34._12_4_ = auVar17._12_4_ ^ 0x80000000;
        fVar36 = -auVar30._0_4_;
        uVar3 = vcmpss_avx512f(auVar17,local_48,1);
        bVar8 = (bool)((byte)uVar3 & 1);
        auVar23._4_12_ = auVar34._4_12_;
        auVar23._0_4_ = (uint)bVar8 * (int)fVar36 + (uint)!bVar8 * (int)-fVar40;
        uVar3 = vcmpss_avx512f(local_48,auVar17,1);
        bVar8 = (bool)((byte)uVar3 & 1);
        auVar24._0_4_ = (uint)bVar8 * (int)fVar36 + (uint)!bVar8 * (int)-fVar40;
        auVar24._4_12_ = auVar23._4_12_;
        local_48 = vinsertps_avx(auVar23,auVar24,0x10);
      }
      else {
        auVar7._8_4_ = 0x80000000;
        auVar7._0_8_ = 0x8000000080000000;
        auVar7._12_4_ = 0x80000000;
        auVar19 = vxorps_avx512vl(local_48,auVar7);
        auVar17 = vmaxss_avx(auVar17,auVar19);
        auVar17 = vmaxss_avx(auVar17,ZEXT816(0) << 0x40);
        local_48 = vinsertps_avx(auVar17,auVar17,0x1d);
      }
    }
    local_68 = (Interval)vmovlps_avx(local_48);
    uVar9 = (uint)(local_d0.state >> 0x2d) ^ (uint)(local_d0.state >> 0x1b);
    bVar11 = (byte)(local_d0.state >> 0x3b);
    auVar17 = vcvtusi2ss_avx512f(in_XMM5,uVar9 >> bVar11 | uVar9 << 0x20 - bVar11);
    auVar17 = vminss_avx(ZEXT416((uint)(auVar17._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    uVar3 = vcmpss_avx512f(auVar17,ZEXT416(0xbf000000),1);
    bVar8 = (bool)((byte)uVar3 & 1);
    auVar17._0_4_ = (Float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * 0x3f800000);
    IVar26.high = auVar17._0_4_;
    IVar26.low = auVar17._0_4_;
    local_a8._8_4_ = auVar17._0_4_;
    local_a8._0_4_ = auVar17._0_4_;
    local_a8._4_4_ = auVar17._0_4_;
    local_a8._12_4_ = auVar17._0_4_;
    local_d0.state = local_d0.state * 0x5851f42d4c957f2d + local_d0.inc;
    local_c0 = lVar13;
    auVar31._0_8_ = pbrt::Interval::operator*(&local_d8,IVar26);
    auVar31._8_56_ = extraout_var_03;
    local_d8 = (Interval)vmovlps_avx(auVar31._0_16_);
    auVar32._0_8_ = pbrt::Interval::operator*(&local_b0,(Interval)local_a8._0_8_);
    auVar32._8_56_ = extraout_var_04;
    local_58 = auVar32._0_16_;
    local_b0 = (Interval)vmovlps_avx(local_58);
    dVar25 = getPrecise(&local_60,&local_d0);
    local_a8._0_8_ = dVar25;
    local_70 = getPrecise(&local_d8,&local_d0);
    local_78 = getPrecise(&local_b0,&local_d0);
    local_80 = getPrecise(&local_68,&local_d0);
    IVar26 = pbrt::DifferenceOfProducts
                       ((Interval)local_98._0_8_,local_d8,(Interval)local_58._0_8_,
                        (Interval)local_48._0_8_);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_78;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_80;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_70;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_a8._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_78 * local_80;
    auVar17 = vfmsub132sd_fma(auVar39,auVar35,auVar1);
    auVar19 = vfnmadd213sd_fma(auVar42,auVar41,auVar35);
    local_b8 = auVar17._0_8_ + auVar19._0_8_;
    in_ZMM1 = ZEXT864((ulong)local_b8);
    local_98._8_8_ = extraout_XMM0_Qb;
    local_98._0_4_ = IVar26.low;
    local_98._4_4_ = IVar26.high;
    local_f8.ptr_._0_4_ = IVar26.low;
    testing::internal::CmpHelperGE<double,float>
              (local_f0,"pr","r.LowerBound()",&local_b8,(float *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      std::ostream::operator<<((ostream *)(local_f8.ptr_ + 0x10),(int)local_c0);
      in_ZMM1._8_56_ = extraout_var_07;
      in_ZMM1._0_8_ = extraout_XMM1_Qa;
      pcVar14 = "";
      if (local_e8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar14 = ((local_e8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                 ,0x32a,pcVar14);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (local_f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar8 = testing::internal::IsTrue(true);
        if ((bVar8) &&
           (local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_f8.ptr_ + 8))();
          in_ZMM1._8_56_ = extraout_var_08;
          in_ZMM1._0_8_ = extraout_XMM1_Qa_00;
        }
        local_f8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    in_ZMM0 = ZEXT1664(local_98);
    uVar2 = vextractps_avx(local_98,1);
    local_f8.ptr_._0_4_ = (Float)uVar2;
    testing::internal::CmpHelperLE<double,float>
              (local_f0,"pr","r.UpperBound()",&local_b8,(float *)&local_f8);
    lVar13 = local_c0;
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      auVar17 = std::ostream::operator<<((ostream *)(local_f8.ptr_ + 0x10),(int)lVar13);
      in_ZMM1._0_8_ = auVar17._8_8_;
      in_ZMM0._0_8_ = auVar17._0_8_;
      in_ZMM1._8_56_ = extraout_var_09;
      in_ZMM0._8_56_ = extraout_var_05;
      pcVar14 = "";
      if (local_e8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar14 = ((local_e8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                 ,0x32b,pcVar14);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (local_f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar8 = testing::internal::IsTrue(true);
        if ((bVar8) &&
           (local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          auVar17 = (**(code **)(*(long *)local_f8.ptr_ + 8))();
          in_ZMM1._0_8_ = auVar17._8_8_;
          in_ZMM0._0_8_ = auVar17._0_8_;
          in_ZMM1._8_56_ = extraout_var_10;
          in_ZMM0._8_56_ = extraout_var_06;
        }
        local_f8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar13 = lVar13 + 1;
    puVar12 = puVar12 + -0x4f5c17a566d501a4;
    uVar15 = uVar15 + 2;
    uVar16 = uVar16 + 0x7fb5d329728ea185;
  } while (lVar13 != 1000000);
  return;
}

Assistant:

TEST(FloatInterval, DifferenceOfProducts) {
    for (int trial = 0; trial < kFloatIntervalIters; ++trial) {
        RNG rng(trial);

        Interval a = Abs(getFloat(rng));
        Interval b = Abs(getFloat(rng));
        Interval c = Abs(getFloat(rng));
        Interval d = Abs(getFloat(rng));

        Float sign = rng.Uniform<Float>() < -0.5 ? -1 : 1;
        b *= sign;
        c *= sign;

        double pa = getPrecise(a, rng);
        double pb = getPrecise(b, rng);
        double pc = getPrecise(c, rng);
        double pd = getPrecise(d, rng);

        Interval r = DifferenceOfProducts(a, b, c, d);
        double pr = DifferenceOfProducts(pa, pb, pc, pd);

        EXPECT_GE(pr, r.LowerBound()) << trial;
        EXPECT_LE(pr, r.UpperBound()) << trial;
    }
}